

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_is_a(REF_GEOM ref_geom,REF_INT node,REF_INT type,REF_BOOL *it_is)

{
  int iVar1;
  REF_ADJ_ITEM pRVar2;
  ulong uVar3;
  REF_INT RVar4;
  
  *it_is = 0;
  uVar3 = 0xffffffff;
  if (-1 < node) {
    uVar3 = 0xffffffff;
    if (node < ref_geom->ref_adj->nnode) {
      uVar3 = (ulong)(uint)ref_geom->ref_adj->first[(uint)node];
    }
  }
  if ((int)uVar3 != -1) {
    RVar4 = ref_geom->ref_adj->item[(int)uVar3].ref;
    do {
      if (ref_geom->descr[RVar4 * 6] == type) {
        *it_is = 1;
        return 0;
      }
      pRVar2 = ref_geom->ref_adj->item;
      iVar1 = pRVar2[(int)uVar3].next;
      uVar3 = (ulong)iVar1;
      if (uVar3 == 0xffffffffffffffff) {
        RVar4 = -1;
      }
      else {
        RVar4 = pRVar2[uVar3].ref;
      }
    } while (iVar1 != -1);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_is_a(REF_GEOM ref_geom, REF_INT node, REF_INT type,
                                 REF_BOOL *it_is) {
  REF_INT item, geom;
  *it_is = REF_FALSE;
  each_ref_adj_node_item_with_ref(ref_geom_adj(ref_geom), node, item, geom) {
    if (type == ref_geom_type(ref_geom, geom)) {
      *it_is = REF_TRUE;
      return REF_SUCCESS;
    }
  }
  return REF_SUCCESS;
}